

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *this,PolyNf *t)

{
  PolyNf *in_RSI;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_RDI;
  PolyNf *in_stack_00000050;
  int in_stack_ffffffffffffffdc;
  RealConstantType *in_stack_ffffffffffffffe0;
  
  RealConstantType::RealConstantType(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  PolyNf::PolyNf(in_RSI,(PolyNf *)in_RDI);
  Polynom(this,(Numeral *)t,in_stack_00000050);
  RealConstantType::~RealConstantType((RealConstantType *)0x459f5b);
  integrity(in_RDI);
  return;
}

Assistant:

Polynom<Number>::Polynom(PolyNf t) 
  : Polynom(Numeral(1), t) 
{ integrity();  }